

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O0

void __thiscall
ScriptElement_ConvertBinaryToNumber_Test::ScriptElement_ConvertBinaryToNumber_Test
          (ScriptElement_ConvertBinaryToNumber_Test *this)

{
  ScriptElement_ConvertBinaryToNumber_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ScriptElement_ConvertBinaryToNumber_Test_0088de80;
  return;
}

Assistant:

TEST(ScriptElement, ConvertBinaryToNumber) {
  ScriptElement bi_num_elem = ScriptElement(ByteData("ff7f"));
  int64_t converted = 0;
  EXPECT_TRUE(bi_num_elem.ConvertBinaryToNumber(&converted));
  EXPECT_EQ(32767, converted);

  bi_num_elem = ScriptElement(ByteData("ffffffffffff"));
  converted = 0;
  EXPECT_FALSE(bi_num_elem.ConvertBinaryToNumber(&converted));
  EXPECT_EQ(0, converted);

  bi_num_elem = ScriptElement(ScriptOperator::OP_12);
  converted = 0;
  EXPECT_FALSE(bi_num_elem.ConvertBinaryToNumber(&converted));
  EXPECT_EQ(0, converted);
}